

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Selector>::moveAppend
          (QGenericArrayOps<QCss::Selector> *this,Selector *b,Selector *e)

{
  qsizetype *pqVar1;
  Selector *pSVar2;
  
  if (b != e) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::Selector>).ptr;
    for (; b < e; b = (Selector *)((QArrayDataPointer<QCss::BasicSelector> *)b + 1)) {
      QArrayDataPointer<QCss::BasicSelector>::QArrayDataPointer
                ((QArrayDataPointer<QCss::BasicSelector> *)
                 (pSVar2 + (this->super_QArrayDataPointer<QCss::Selector>).size),
                 (QArrayDataPointer<QCss::BasicSelector> *)b);
      pqVar1 = &(this->super_QArrayDataPointer<QCss::Selector>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }